

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

void __thiscall Application::processOrder(Application *this,Order *order)

{
  pointer pcVar1;
  bool bVar2;
  iterator iVar3;
  queue<Order,_std::deque<Order,_std::allocator<Order>_>_> orders;
  key_type local_98;
  _Deque_base<Order,_std::allocator<Order>_> local_78;
  
  bVar2 = OrderMatcher::insert(&this->m_orderMatcher,order);
  if (bVar2) {
    updateOrder(this,order,'0');
    local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (Order *)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<Order,_std::allocator<Order>_>::_M_initialize_map(&local_78,0);
    pcVar1 = (order->m_symbol)._M_dataplus._M_p;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar1,pcVar1 + (order->m_symbol)._M_string_length);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
                    *)&this->m_orderMatcher,&local_98);
    if ((_Rb_tree_header *)iVar3._M_node !=
        &(this->m_orderMatcher).m_markets._M_t._M_impl.super__Rb_tree_header) {
      Market::match((Market *)(iVar3._M_node + 2),
                    (queue<Order,_std::deque<Order,_std::allocator<Order>_>_> *)&local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    while (((long)local_78._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_78._M_impl.super__Deque_impl_data._M_finish._M_first >> 6) *
           -0x5555555555555555 +
           (((long)local_78._M_impl.super__Deque_impl_data._M_finish._M_node -
             (long)local_78._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
           (ulong)(local_78._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 2 != ((long)local_78._M_impl.super__Deque_impl_data._M_start._M_last -
                   (long)local_78._M_impl.super__Deque_impl_data._M_start._M_cur >> 6) *
                  0x5555555555555555) {
      updateOrder(this,local_78._M_impl.super__Deque_impl_data._M_start._M_cur,
                  ((local_78._M_impl.super__Deque_impl_data._M_start._M_cur)->m_quantity ==
                  (local_78._M_impl.super__Deque_impl_data._M_start._M_cur)->m_executedQuantity) +
                  '1');
      std::deque<Order,_std::allocator<Order>_>::pop_front
                ((deque<Order,_std::allocator<Order>_> *)&local_78);
    }
    std::deque<Order,_std::allocator<Order>_>::~deque
              ((deque<Order,_std::allocator<Order>_> *)&local_78);
    return;
  }
  updateOrder(this,order,'8');
  return;
}

Assistant:

void Application::processOrder(const Order &order) {
  if (m_orderMatcher.insert(order)) {
    acceptOrder(order);

    std::queue<Order> orders;
    m_orderMatcher.match(order.getSymbol(), orders);

    while (orders.size()) {
      fillOrder(orders.front());
      orders.pop();
    }
  } else {
    rejectOrder(order);
  }
}